

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall Chainstate::NeedsRedownload(Chainstate *this)

{
  long lVar1;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *block;
  int in_stack_ffffffffffffffcc;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  bool bVar2;
  CBlockIndex *local_20;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffffd7,
                              CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
             in_stack_ffffffffffffffcc,(AnnotatedMixin<std::recursive_mutex> *)0x7e9954);
  local_20 = CChain::Tip((CChain *)in_RDI);
  while( true ) {
    bVar2 = false;
    if (local_20 != (CBlockIndex *)0x0) {
      bVar2 = DeploymentActiveAt<Consensus::BuriedDeployment>
                        (in_RDI,(ChainstateManager *)
                                (ulong)CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)
                         ,(BuriedDeployment)((uint)in_stack_ffffffffffffffcc >> 0x10));
    }
    if (bVar2 == false) break;
    if ((local_20->nStatus & 0x80) == 0) {
      local_9 = true;
LAB_007e99c9:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_9;
      }
      __stack_chk_fail();
    }
    local_20 = local_20->pprev;
  }
  local_9 = false;
  goto LAB_007e99c9;
}

Assistant:

bool Chainstate::NeedsRedownload() const
{
    AssertLockHeld(cs_main);

    // At and above m_params.SegwitHeight, segwit consensus rules must be validated
    CBlockIndex* block{m_chain.Tip()};

    while (block != nullptr && DeploymentActiveAt(*block, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) {
        if (!(block->nStatus & BLOCK_OPT_WITNESS)) {
            // block is insufficiently validated for a segwit client
            return true;
        }
        block = block->pprev;
    }

    return false;
}